

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

bool glcts::verifyFace<unsigned_int,4u,3u,3u>
               (uint *data,GLuint cube_face,uint *expected_values,GLuint image_width)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  bVar11 = false;
  uVar9 = 0;
  uVar4 = cube_face * 0xc;
  uVar8 = cube_face * 0x24;
  do {
    lVar5 = 0;
    uVar3 = uVar4;
    uVar7 = uVar8;
    do {
      if (data[image_width * 4 * uVar9 + cube_face * 0xc + (int)lVar5 * 4] ==
          expected_values[cube_face * 0x24 + uVar9 * 0xc + (int)lVar5 * 4]) {
        uVar1 = 0;
        do {
          uVar2 = uVar1;
          if (uVar2 == 3) {
            iVar6 = 0;
            goto LAB_00d8a5f9;
          }
          uVar1 = uVar2 + 1;
        } while (data[(ulong)uVar3 + uVar2 + 1] == expected_values[(ulong)uVar7 + uVar2 + 1]);
        iVar6 = 1;
LAB_00d8a5f9:
        bVar10 = 2 < uVar2;
      }
      else {
        iVar6 = 1;
        bVar10 = false;
      }
      if (!bVar10) goto LAB_00d8a61a;
      lVar5 = lVar5 + 1;
      uVar7 = uVar7 + 4;
      uVar3 = uVar3 + 4;
    } while (lVar5 != 3);
    iVar6 = 5;
LAB_00d8a61a:
    if ((iVar6 != 5) && (iVar6 != 0)) {
      return bVar11;
    }
    bVar11 = 1 < uVar9;
    uVar9 = uVar9 + 1;
    uVar8 = uVar8 + 0xc;
    uVar4 = uVar4 + image_width * 4;
    if (uVar9 == 3) {
      return bVar11;
    }
  } while( true );
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}